

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.hpp
# Opt level: O3

bool __thiscall
ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546>::getRequestBuffer
          (ProtocolRead<unsigned_short,_6UL,_(unsigned_short)1546> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer)

{
  pointer puVar1;
  uint8_t checksum;
  uchar uVar2;
  long lVar3;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(buffer,9);
  puVar1 = (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1[0] = 0xeb;
  puVar1[1] = 0x90;
  puVar1[2] = (this->super_ProtocolBase)._id;
  puVar1[3] = '\x04';
  puVar1[4] = (this->super_ProtocolBase)._order;
  puVar1[5] = (uchar)(this->super_ProtocolBase)._register_address;
  puVar1[6] = *(uchar *)((long)&(this->super_ProtocolBase)._register_address + 1);
  puVar1[7] = '\f';
  lVar3 = 2;
  uVar2 = '\0';
  do {
    uVar2 = uVar2 + puVar1[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  puVar1[8] = uVar2;
  return true;
}

Assistant:

bool getRequestBuffer(std::vector<uint8_t> &buffer) {
        uint8_t data = sizeof(Rx) * num ; //读取的话数据部分为需要读取的长度
        buffer.resize(9);
        generateBuffer(&buffer[0], &data, 1);
        return true;
    }